

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void jessilib::config::write_object
               (object *in_object,path *in_filename,string *in_format,text_encoding in_encoding)

{
  byte bVar1;
  _Ios_Openmode __mode;
  file_error *this;
  string local_258;
  long local_228;
  ofstream file;
  text_encoding in_encoding_local;
  string *in_format_local;
  path *in_filename_local;
  object *in_object_local;
  
  __mode = std::operator|(_S_out,_S_bin);
  std::ofstream::ofstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            ((ofstream *)&local_228,in_filename,__mode);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar1 & 1) == 0) {
    get_format(&local_258,in_filename,in_format);
    serialize_object((ostream *)&local_228,in_object,&local_258,in_encoding);
    std::__cxx11::string::~string((string *)&local_258);
    std::ofstream::~ofstream(&local_228);
    return;
  }
  this = (file_error *)__cxa_allocate_exception(0x10);
  file_error::file_error(this,in_filename);
  __cxa_throw(this,&file_error::typeinfo,file_error::~file_error);
}

Assistant:

void config::write_object(const object& in_object, const std::filesystem::path& in_filename, const std::string& in_format, text_encoding in_encoding) {
	// Open up file for writing
	std::ofstream file{ in_filename, std::ios::out | std::ios::binary };
	if (!file) {
		// Failed to open the file; throw file_error
		throw file_error( in_filename );
	}

	// Deserialize1
	return serialize_object(file, in_object, get_format(in_filename, in_format), in_encoding);
}